

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_clock.c
# Opt level: O3

int oonf_clock_update(void)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ulong uVar4;
  uint64_t now;
  
  iVar1 = os_clock_linux_gettime64(&now);
  if (iVar1 == 0) {
    now_times = now - start_time;
    iVar1 = 0;
  }
  else {
    uVar4 = (ulong)_oonf_clock_subsystem.logging;
    iVar1 = -1;
    if (((&log_global_mask)[uVar4] & 4) != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      oonf_log(4,uVar4,"src/base/oonf_clock.c",0x70,0,0,"OS clock is not working: %s (%d)\n",pcVar3,
               *piVar2);
    }
  }
  return iVar1;
}

Assistant:

int
oonf_clock_update(void) {
  uint64_t now;
  if (os_clock_gettime64(&now)) {
    OONF_WARN(LOG_CLOCK, "OS clock is not working: %s (%d)\n", strerror(errno), errno);
    return -1;
  }

  now_times = now - start_time;
  return 0;
}